

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O0

void RigidBodyDynamics::ComputeContactImpulsesRangeSpaceSparse
               (Model *model,VectorNd *Q,VectorNd *QDotMinus,ConstraintSet *CS,VectorNd *QDotPlus)

{
  bool in_stack_00000047;
  MatrixNd *in_stack_00000048;
  ConstraintSet *in_stack_00000050;
  VectorNd *in_stack_00000058;
  Model *in_stack_00000060;
  VectorNd *in_stack_00000158;
  VectorNd *in_stack_00000160;
  VectorNd *in_stack_00000168;
  MatrixNd *in_stack_00000170;
  MatrixNd *in_stack_00000178;
  Model *in_stack_00000180;
  VectorNd *in_stack_00000190;
  MatrixNd *in_stack_00000198;
  VectorNd *in_stack_000001a0;
  LinearSolver in_stack_000001a8;
  VectorNd *in_stack_000002c8;
  VectorNd *in_stack_000002d0;
  VectorNd *in_stack_000002d8;
  Model *in_stack_000002e0;
  undefined1 in_stack_0000060f;
  MatrixNd *in_stack_00000610;
  VectorNd *in_stack_00000618;
  Model *in_stack_00000620;
  EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  *in_stack_ffffffffffffff48;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffffff50;
  
  UpdateKinematicsCustom(in_stack_000002e0,in_stack_000002d8,in_stack_000002d0,in_stack_000002c8);
  CompositeRigidBodyAlgorithm
            (in_stack_00000620,in_stack_00000618,in_stack_00000610,(bool)in_stack_0000060f);
  CalcContactJacobian(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,
                      in_stack_00000047);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (in_stack_ffffffffffffff50,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_ffffffffffffff48);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48)
  ;
  SolveContactSystemRangeSpaceSparse
            (in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168,
             in_stack_00000160,in_stack_00000158,in_stack_00000190,in_stack_00000198,
             in_stack_000001a0,in_stack_000001a8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x14ec6f);
  return;
}

Assistant:

RBDL_DLLAPI
void ComputeContactImpulsesRangeSpaceSparse (
		Model &model,
		const Math::VectorNd &Q,
		const Math::VectorNd &QDotMinus,
		ConstraintSet &CS,
		Math::VectorNd &QDotPlus
		) {
	// Compute H
	UpdateKinematicsCustom (model, &Q, NULL, NULL);
	CompositeRigidBodyAlgorithm (model, Q, CS.H, false);

	// Compute G
	CalcContactJacobian (model, Q, CS, CS.G, false);

	SolveContactSystemRangeSpaceSparse (model, CS.H, CS.G, CS.H * QDotMinus, CS.v_plus, QDotPlus, CS.impulse, CS.K, CS.a, CS.linear_solver);
}